

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O0

mraa_led_context mraa_led_init(int index)

{
  mraa_led_context p_Stack_10;
  int index_local;
  
  if (plat == (mraa_board_t *)0x0) {
    syslog(3,"led: init: platform not initialised");
    p_Stack_10 = (mraa_led_context)0x0;
  }
  else if (plat->led_dev_count == 0) {
    syslog(3,"led: init: no led device defined in platform");
    p_Stack_10 = (mraa_led_context)0x0;
  }
  else if (index < 0) {
    syslog(3,"led: init: led index cannot be negative");
    p_Stack_10 = (mraa_led_context)0x0;
  }
  else if ((uint)index < plat->led_dev_count) {
    p_Stack_10 = mraa_led_init_internal(plat->led_dev[index].name);
  }
  else {
    syslog(3,"led: init: requested led above led device count");
    p_Stack_10 = (mraa_led_context)0x0;
  }
  return p_Stack_10;
}

Assistant:

mraa_led_context
mraa_led_init(int index)
{
    if (plat == NULL) {
        syslog(LOG_ERR, "led: init: platform not initialised");
        return NULL;
    }

    if (plat->led_dev_count == 0) {
        syslog(LOG_ERR, "led: init: no led device defined in platform");
        return NULL;
    }

    if (index < 0) {
        syslog(LOG_ERR, "led: init: led index cannot be negative");
        return NULL;
    }

    if (index >= plat->led_dev_count) {
        syslog(LOG_ERR, "led: init: requested led above led device count");
        return NULL;
    }

    return mraa_led_init_internal((char*) plat->led_dev[index].name);
}